

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O1

unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
CreateVertexTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this,
          MeshAttributeIndicesEncodingData *encoding_data)

{
  Mesh *pMVar1;
  CornerTable *corner_table;
  TraversalObserver traversal_observer;
  MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
  *this_00;
  MeshAttributeIndicesEncodingData *in_RDX;
  DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  att_traverser;
  DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  local_c0;
  
  this_00 = (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
             *)operator_new(0xc0);
  pMVar1 = (Mesh *)(encoding_data->encoded_attribute_value_index_to_corner_map).
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this_00->super_PointsSequencer).out_point_ids_ =
       (vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
        *)0x0;
  (this_00->super_PointsSequencer)._vptr_PointsSequencer =
       (_func_int **)&PTR__MeshTraversalSequencer_001df920;
  (((_Bit_iterator *)
   ((long)&(this_00->traverser_).
           super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl + 0x10))->
  super__Bit_iterator_base)._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this_00->traverser_).
                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                   .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl + 0x18) = 0;
  (((_Bit_iterator *)
   ((long)&(this_00->traverser_).
           super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl + 0x10))->
  super__Bit_iterator_base)._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this_00->traverser_).
                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                   .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl + 0x18) =
       0;
  *(_Bit_pointer *)
   ((long)&(this_00->traverser_).
           super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl + 0x20) =
       (_Bit_pointer)0x0;
  *(uint *)((long)&(this_00->traverser_).
                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                   .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl + 8) = 0;
  (this_00->traverser_).
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .traversal_observer_.sequencer_ = (PointsSequencer *)0x0;
  (this_00->traverser_).
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->traverser_).
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .traversal_observer_.encoding_data_ = (MeshAttributeIndicesEncodingData *)0x0;
  (this_00->traverser_).
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .traversal_observer_.mesh_ = (Mesh *)0x0;
  (this_00->traverser_).
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .corner_table_ = (CornerTable *)0x0;
  (this_00->traverser_).
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .traversal_observer_.att_connectivity_ = (CornerTable *)0x0;
  *(uint *)((long)&(this_00->traverser_).
                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                   .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl + 8) = 0;
  *(_Bit_pointer *)
   ((long)&(this_00->traverser_).
           super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl + 0x20) =
       (_Bit_pointer)0x0;
  (this_00->traverser_).
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->traverser_).
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  ._vptr_TraverserBase = (_func_int **)&PTR__DepthFirstTraverser_001df968;
  *(pointer *)
   ((long)&(this_00->traverser_).corner_traversal_stack_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this_00->traverser_).corner_traversal_stack_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this_00->traverser_).corner_traversal_stack_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  this_00->mesh_ = pMVar1;
  this_00->encoding_data_ = in_RDX;
  this_00->corner_order_ =
       (vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        *)0x0;
  corner_table = (CornerTable *)
                 (encoding_data->vertex_to_encoded_attribute_value_index_map).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
  local_c0.
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_c0.
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_c0.
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_c0.
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_c0.
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_c0.
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .corner_table_ = (CornerTable *)0x0;
  local_c0.
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .traversal_observer_.att_connectivity_ = (CornerTable *)0x0;
  local_c0.
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .traversal_observer_.encoding_data_ = (MeshAttributeIndicesEncodingData *)0x0;
  local_c0.
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .traversal_observer_.mesh_ = (Mesh *)0x0;
  local_c0.
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .traversal_observer_.sequencer_ = (PointsSequencer *)0x0;
  local_c0.
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_c0.
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_c0.
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_c0.
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_c0.
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_c0.
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  ._vptr_TraverserBase = (_func_int **)&PTR__DepthFirstTraverser_001df968;
  local_c0.corner_traversal_stack_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.corner_traversal_stack_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.corner_traversal_stack_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  traversal_observer.encoding_data_ = in_RDX;
  traversal_observer.att_connectivity_ = corner_table;
  traversal_observer.mesh_ = pMVar1;
  traversal_observer.sequencer_ = (PointsSequencer *)this_00;
  TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  ::Init(&local_c0.
          super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
         ,corner_table,traversal_observer);
  this_00->corner_order_ =
       (vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        *)&encoding_data[2].num_values;
  MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
  ::SetTraverser(this_00,&local_c0);
  (this->super_MeshEdgebreakerEncoderImplInterface)._vptr_MeshEdgebreakerEncoderImplInterface =
       (_func_int **)this_00;
  local_c0.
  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  ._vptr_TraverserBase = (_func_int **)&PTR__DepthFirstTraverser_001df968;
  if (local_c0.corner_traversal_stack_.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.corner_traversal_stack_.
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.corner_traversal_stack_.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.corner_traversal_stack_.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  ::~TraverserBase(&local_c0.
                    super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                  );
  return (__uniq_ptr_data<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>,_true,_true>
          )(__uniq_ptr_data<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<PointsSequencer>
MeshEdgebreakerEncoderImpl<TraversalEncoder>::CreateVertexTraversalSequencer(
    MeshAttributeIndicesEncodingData *encoding_data) {
  typedef typename TraverserT::TraversalObserver AttObserver;
  typedef typename TraverserT::CornerTable CornerTable;

  std::unique_ptr<MeshTraversalSequencer<TraverserT>> traversal_sequencer(
      new MeshTraversalSequencer<TraverserT>(mesh_, encoding_data));

  AttObserver att_observer(corner_table_.get(), mesh_,
                           traversal_sequencer.get(), encoding_data);

  TraverserT att_traverser;
  att_traverser.Init(corner_table_.get(), att_observer);

  // Set order of corners to simulate the corner order of the decoder.
  traversal_sequencer->SetCornerOrder(processed_connectivity_corners_);
  traversal_sequencer->SetTraverser(att_traverser);
  return std::move(traversal_sequencer);
}